

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestsList
               (ostream *stream,
               vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *test_suites)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppTVar2;
  pointer ppTVar3;
  ostream *poVar4;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  undefined1 local_98 [8];
  string kTestsuites;
  long local_68;
  string local_58;
  int local_34;
  
  local_98 = (undefined1  [8])&kTestsuites._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"testsuites","");
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"<",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,(char *)local_98,(long)kTestsuites._M_dataplus._M_p);
  local_34 = 0;
  ppTVar3 = (test_suites->
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>)._M_impl
            .super__Vector_impl_data._M_start;
  ppTVar2 = (test_suites->
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  if (ppTVar3 != ppTVar2) {
    local_34 = 0;
    do {
      local_34 = local_34 +
                 (int)((ulong)((long)((*ppTVar3)->test_info_list_).
                                     super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)((*ppTVar3)->test_info_list_).
                                    super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
      ppTVar3 = ppTVar3 + 1;
    } while (ppTVar3 != ppTVar2);
  }
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"tests","");
  StreamableToString<int>((string *)((long)&kTestsuites.field_2 + 8),&local_34);
  OutputXmlAttribute(stream,(string *)local_98,&local_58,(string *)((long)&kTestsuites.field_2 + 8))
  ;
  if ((long *)kTestsuites.field_2._8_8_ != &stack0xffffffffffffff98) {
    operator_delete((void *)kTestsuites.field_2._8_8_,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"name","");
  kTestsuites.field_2._8_8_ = &stack0xffffffffffffff98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&kTestsuites.field_2 + 8),"AllTests","");
  OutputXmlAttribute(stream,(string *)local_98,&local_58,(string *)((long)&kTestsuites.field_2 + 8))
  ;
  if ((long *)kTestsuites.field_2._8_8_ != &stack0xffffffffffffff98) {
    operator_delete((void *)kTestsuites.field_2._8_8_,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
  ppTVar2 = (test_suites->
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  for (ppTVar3 = (test_suites->
                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppTVar3 != ppTVar2; ppTVar3 = ppTVar3 + 1
      ) {
    PrintXmlTestSuite(stream,*ppTVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"</",2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)local_98,(long)kTestsuites._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,">\n",2);
  if (local_98 != (undefined1  [8])&kTestsuites._M_string_length) {
    operator_delete((void *)local_98,kTestsuites._M_string_length + 1);
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestsList(
    std::ostream* stream, const std::vector<TestSuite*>& test_suites) {
  const std::string kTestsuites = "testsuites";

  *stream << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
  *stream << "<" << kTestsuites;

  int total_tests = 0;
  for (auto test_suite : test_suites) {
    total_tests += test_suite->total_test_count();
  }
  OutputXmlAttribute(stream, kTestsuites, "tests",
                     StreamableToString(total_tests));
  OutputXmlAttribute(stream, kTestsuites, "name", "AllTests");
  *stream << ">\n";

  for (auto test_suite : test_suites) {
    PrintXmlTestSuite(stream, *test_suite);
  }
  *stream << "</" << kTestsuites << ">\n";
}